

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * Catch::toString(string *__return_storage_ptr__,string *value)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long lVar4;
  string *psVar5;
  char cVar6;
  IMutableContext *pIVar7;
  undefined8 *puVar8;
  long *plVar9;
  char *pcVar10;
  ulong *puVar11;
  size_type *psVar12;
  ulong uVar13;
  ulong uVar14;
  string subs;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  undefined8 *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  string *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar3 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar3,pcVar3 + value->_M_string_length);
  pIVar7 = getCurrentMutableContext();
  (*(pIVar7->super_IContext)._vptr_IContext[6])(&local_f8);
  cVar6 = (**(code **)(*(size_type *)local_f8._M_dataplus._M_p + 0x58))();
  local_58 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_f8._M_dataplus._M_p + 0x18))();
  }
  if ((cVar6 != '\0') && (local_98._M_string_length != 0)) {
    paVar2 = &local_f8.field_2;
    uVar14 = 0;
    do {
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      local_f8._M_dataplus._M_p = (pointer)paVar2;
      if (local_98._M_dataplus._M_p[uVar14] == '\t') {
        pcVar10 = "\\t";
LAB_00138b88:
        std::__cxx11::string::_M_replace((ulong)&local_f8,0,(char *)0x0,(ulong)pcVar10);
        if (local_f8._M_string_length != 0) {
          std::__cxx11::string::substr((ulong)local_50,(ulong)&local_98);
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_50,(ulong)local_f8._M_dataplus._M_p);
          puVar11 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar11) {
            local_c8 = *puVar11;
            lStack_c0 = plVar9[3];
            local_d8 = &local_c8;
          }
          else {
            local_c8 = *puVar11;
            local_d8 = (ulong *)*plVar9;
          }
          local_d0 = plVar9[1];
          *plVar9 = (long)puVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          uVar14 = uVar14 + 1;
          std::__cxx11::string::substr((ulong)&local_78,(ulong)&local_98);
          uVar13 = 0xf;
          if (local_d8 != &local_c8) {
            uVar13 = local_c8;
          }
          if (uVar13 < (ulong)(local_70 + local_d0)) {
            uVar13 = 0xf;
            if (local_78 != local_68) {
              uVar13 = local_68[0];
            }
            if (uVar13 < (ulong)(local_70 + local_d0)) goto LAB_00138c77;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_d8);
          }
          else {
LAB_00138c77:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_78);
          }
          puVar1 = puVar8 + 2;
          if ((undefined8 *)*puVar8 == puVar1) {
            local_a8 = *puVar1;
            uStack_a0 = puVar8[3];
            local_b8 = &local_a8;
          }
          else {
            local_a8 = *puVar1;
            local_b8 = (undefined8 *)*puVar8;
          }
          local_b0 = puVar8[1];
          *puVar8 = puVar1;
          puVar8[1] = 0;
          *(undefined1 *)puVar1 = 0;
          std::__cxx11::string::operator=((string *)&local_98,(string *)&local_b8);
          if (local_b8 != &local_a8) {
            operator_delete(local_b8);
          }
          if (local_78 != local_68) {
            operator_delete(local_78);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
        }
      }
      else {
        pcVar10 = "\\n";
        if (local_98._M_dataplus._M_p[uVar14] == '\n') goto LAB_00138b88;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < local_98._M_string_length);
  }
  std::operator+(&local_f8,"\"",&local_98);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
  psVar5 = local_58;
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar12) {
    lVar4 = plVar9[3];
    (local_58->field_2)._M_allocated_capacity = *psVar12;
    *(long *)((long)&local_58->field_2 + 8) = lVar4;
  }
  else {
    (local_58->_M_dataplus)._M_p = (pointer)*plVar9;
    (local_58->field_2)._M_allocated_capacity = *psVar12;
  }
  local_58->_M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return psVar5;
}

Assistant:

std::string toString( std::string const& value ) {
    std::string s = value;
    if( getCurrentContext().getConfig()->showInvisibles() ) {
        for(size_t i = 0; i < s.size(); ++i ) {
            std::string subs;
            switch( s[i] ) {
            case '\n': subs = "\\n"; break;
            case '\t': subs = "\\t"; break;
            default: break;
            }
            if( !subs.empty() ) {
                s = s.substr( 0, i ) + subs + s.substr( i+1 );
                ++i;
            }
        }
    }
    return "\"" + s + "\"";
}